

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O1

void __thiscall
google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
          (InternalMetadata *this,UnknownFieldSet *other)

{
  UnknownFieldSet *this_00;
  
  if ((this->ptr_ & 1U) == 0) {
    this_00 = mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this);
  }
  else {
    this_00 = (UnknownFieldSet *)((this->ptr_ & 0xfffffffffffffffcU) + 8);
  }
  UnknownFieldSet::MergeFrom(this_00,other);
  return;
}

Assistant:

PROTOBUF_NOINLINE void DoMergeFrom(const T& other) {
    mutable_unknown_fields<T>()->MergeFrom(other);
  }